

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

path * __thiscall boost::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  int iVar1;
  long lVar2;
  path name;
  allocator<char> local_29;
  path local_28;
  
  filename(&local_28,this);
  detail::dot_path();
  iVar1 = compare(&local_28,&detail::dot_path::dot_pth);
  if (iVar1 != 0) {
    detail::dot_dot_path();
    iVar1 = compare(&local_28,&detail::dot_dot_path::dot_dot);
    if (iVar1 != 0) {
      lVar2 = std::__cxx11::string::rfind((char)&local_28,0x2e);
      if (lVar2 != -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,local_28.m_pathname._M_dataplus._M_p + lVar2,
                   &local_29);
        goto LAB_0010f684;
      }
    }
  }
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  (__return_storage_ptr__->m_pathname)._M_string_length = 0;
  (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
LAB_0010f684:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28.m_pathname._M_dataplus._M_p != &local_28.m_pathname.field_2) {
    operator_delete(local_28.m_pathname._M_dataplus._M_p,
                    local_28.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::extension() const
  {
    path name(filename());
    if (name == detail::dot_path() || name == detail::dot_dot_path()) return path();
    size_type pos(name.m_pathname.rfind(dot));
    return pos == string_type::npos
      ? path()
      : path(name.m_pathname.c_str() + pos);
  }